

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDAWBICMetropolisSampler.cpp
# Opt level: O0

double calculateLogLikelihood
                 (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *theta,vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *phi,
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *frequencyMatrix,
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *docVoca)

{
  uint uVar1;
  size_type sVar2;
  const_reference this;
  ulong uVar3;
  reference pvVar4;
  const_reference pvVar5;
  const_reference this_00;
  const_reference pvVar6;
  reference pvVar7;
  double dVar8;
  int local_9c;
  uint m;
  int l;
  double documentLogLikelihood;
  undefined1 local_88 [4];
  int d_1;
  value_type local_70;
  int local_68;
  int d;
  allocator<std::vector<double,_std::allocator<double>_>_> local_51;
  undefined1 local_50 [8];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  wordProbMat;
  uint V;
  uint D;
  double logLikelihood;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *docVoca_local;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *frequencyMatrix_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *phi_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *theta_local;
  
  _V = 0.0;
  sVar2 = std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::size(docVoca);
  wordProbMat.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (uint)sVar2;
  this = std::
         vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ::operator[](phi,0);
  sVar2 = std::vector<double,_std::allocator<double>_>::size(this);
  wordProbMat.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (uint)sVar2;
  uVar3 = (ulong)wordProbMat.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(&local_51);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)local_50,uVar3,&local_51);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator(&local_51);
  local_68 = 0;
  while( true ) {
    uVar3 = (ulong)local_68;
    sVar2 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)local_50);
    if (sVar2 <= uVar3) break;
    pvVar4 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)local_50,(long)local_68);
    local_70 = 0.0;
    std::vector<double,_std::allocator<double>_>::assign
              (pvVar4,(ulong)(uint)wordProbMat.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_70);
    local_68 = local_68 + 1;
  }
  dot((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       *)local_88,theta,phi);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)local_50,
              (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)local_88);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)local_88);
  for (documentLogLikelihood._4_4_ = 0;
      documentLogLikelihood._4_4_ <
      wordProbMat.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      documentLogLikelihood._4_4_ = documentLogLikelihood._4_4_ + 1) {
    _m = 0.0;
    local_9c = 0;
    while( true ) {
      pvVar5 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](docVoca,(long)(int)documentLogLikelihood._4_4_);
      sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar5);
      if (sVar2 <= (ulong)(long)local_9c) break;
      pvVar5 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](frequencyMatrix,(long)(int)documentLogLikelihood._4_4_);
      this_00 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::operator[](docVoca,(long)(int)documentLogLikelihood._4_4_);
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (this_00,(long)local_9c);
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar5,(ulong)*pvVar6);
      uVar1 = *pvVar6;
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)local_50,(long)(int)documentLogLikelihood._4_4_);
      pvVar5 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](docVoca,(long)(int)documentLogLikelihood._4_4_);
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar5,(long)local_9c);
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(ulong)*pvVar6);
      dVar8 = log(*pvVar7);
      _m = dVar8 * (double)uVar1 + _m;
      local_9c = local_9c + 1;
    }
    _V = _m + _V;
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)local_50);
  return _V;
}

Assistant:

double calculateLogLikelihood(const vector<vector<double> > &theta, const vector<vector<double> > &phi, const vector<vector<unsigned int> > &frequencyMatrix, const vector<vector<unsigned int> > &docVoca){
    double logLikelihood = 0.0;
    unsigned int D=docVoca.size(), V=phi[0].size();
    vector<vector<double> > wordProbMat(D);
    for(int d=0;d<wordProbMat.size();d++)wordProbMat[d].assign(V,0);
    wordProbMat = dot(theta, phi);
    for(int d=0; d<D; d++){
        double documentLogLikelihood = 0.0;
        for(int l=0; l<docVoca[d].size(); l++){
            unsigned int m = frequencyMatrix[d][docVoca[d][l]];
            documentLogLikelihood += log(wordProbMat[d][docVoca[d][l]]) * m;
        }
        logLikelihood += documentLogLikelihood;
    }
    return logLikelihood;
}